

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

iterator * __thiscall
QMultiHash<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>::erase
          (iterator *__return_storage_ptr__,
          QMultiHash<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*> *this,
          const_iterator it)

{
  byte bVar1;
  Chain *pCVar2;
  MultiNodeChain<QPersistentModelIndexData_*> *pMVar3;
  Span *pSVar4;
  Data *pDVar5;
  ulong uVar6;
  undefined1 *puVar7;
  long lVar8;
  undefined1 *puVar9;
  Chain **ppCVar10;
  Span *pSVar11;
  uint uVar12;
  long in_FS_OFFSET;
  Bucket bucket;
  iterator local_48;
  long local_30;
  ulong uVar13;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.e = (Chain **)&DAT_aaaaaaaaaaaaaaaa;
  local_48.i.d = (Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>
                  *)&DAT_aaaaaaaaaaaaaaaa;
  local_48.i.bucket = (size_t)&DAT_aaaaaaaaaaaaaaaa;
  detach(&local_48,this,it);
  ppCVar10 = local_48.e;
  __return_storage_ptr__->e = local_48.e;
  (__return_storage_ptr__->i).d = local_48.i.d;
  (__return_storage_ptr__->i).bucket = local_48.i.bucket;
  pCVar2 = *local_48.e;
  pMVar3 = pCVar2->next;
  *local_48.e = pMVar3;
  operator_delete(pCVar2,0x10);
  if (pMVar3 != (MultiNodeChain<QPersistentModelIndexData_*> *)0x0) goto LAB_0044e297;
  uVar13 = (__return_storage_ptr__->i).bucket;
  pSVar4 = ((__return_storage_ptr__->i).d)->spans;
  uVar6 = uVar13 >> 7;
  pSVar11 = pSVar4 + uVar6;
  uVar12 = (uint)uVar13 & 0x7f;
  uVar13 = (ulong)uVar12;
  if (ppCVar10 == (Chain **)&pSVar4[uVar6].entries[pSVar11->offsets[uVar13]].storage.field_0x18) {
    bucket.index._0_4_ = uVar12;
    bucket.span = pSVar11;
    bucket.index._4_4_ = 0;
    QHashPrivate::
    Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>::
    erase(this->d,bucket);
    pDVar5 = this->d;
    pSVar4 = pDVar5->spans;
    lVar8 = (long)pSVar11 - (long)pSVar4 >> 4;
    puVar7 = (undefined1 *)(lVar8 * 0x1c71c71c71c71c80 | uVar13);
    if ((puVar7 != (undefined1 *)(pDVar5->numBuckets - 1)) && (pSVar11->offsets[uVar13] != 0xff)) {
      uVar6 = lVar8 * -0x71c71c71c71c71c7 & 0x1ffffffffffffff;
      ppCVar10 = (Chain **)&pSVar4[uVar6].entries[pSVar4[uVar6].offsets[uVar13]].storage.field_0x18;
      goto LAB_0044e28c;
    }
    puVar9 = (undefined1 *)local_48.i.bucket;
    do {
      puVar7 = puVar9 + 1;
      local_48.i.bucket = (size_t)puVar7;
      if ((undefined1 *)((local_48.i.d)->numBuckets - 1) == puVar9) goto LAB_0044e288;
      pSVar11 = (local_48.i.d)->spans + ((ulong)puVar7 >> 7);
      bVar1 = pSVar11->offsets[(uint)puVar7 & 0x7f];
      puVar9 = puVar7;
    } while (bVar1 == 0xff);
  }
  else {
    puVar9 = (undefined1 *)local_48.i.bucket;
    do {
      puVar7 = puVar9 + 1;
      local_48.i.bucket = (size_t)puVar7;
      if ((undefined1 *)((local_48.i.d)->numBuckets - 1) == puVar9) goto LAB_0044e288;
      pSVar11 = (local_48.i.d)->spans + ((ulong)puVar7 >> 7);
      bVar1 = pSVar11->offsets[(uint)puVar7 & 0x7f];
      puVar9 = puVar7;
    } while (bVar1 == 0xff);
  }
  ppCVar10 = (Chain **)&pSVar11->entries[bVar1].storage.field_0x18;
  pDVar5 = local_48.i.d;
  local_48.i.bucket = (size_t)puVar7;
  goto LAB_0044e28c;
LAB_0044e288:
  ppCVar10 = (Chain **)0x0;
  pDVar5 = (Data *)0x0;
  puVar7 = (undefined1 *)0x0;
LAB_0044e28c:
  (__return_storage_ptr__->i).d = pDVar5;
  (__return_storage_ptr__->i).bucket = (size_t)puVar7;
  __return_storage_ptr__->e = ppCVar10;
LAB_0044e297:
  this->m_size = this->m_size + -1;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

iterator erase(const_iterator it)
    {
        Q_ASSERT(d);
        iterator iter = detach(it);
        iterator i = iter;
        Chain *e = *i.e;
        Chain *next = e->next;
        *i.e = next;
        delete e;
        if (!next) {
            if (i.e == &i.i.node()->value) {
                // last remaining entry, erase
                typename Data::Bucket bucket(i.i);
                d->erase(bucket);
                if (bucket.toBucketIndex(d) == d->numBuckets - 1 || bucket.isUnused())
                    i = iterator(++iter.i);
                else // 'i' currently has a nullptr chain. So, we must recreate it
                    i = iterator(bucket.toIterator(d));
            } else {
                i = iterator(++iter.i);
            }
        }
        --m_size;
        Q_ASSERT(m_size >= 0);
        return i;
    }